

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

MethodOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::MethodOptions>
          (Tables *this,MethodOptions *param_1)

{
  MethodOptions *this_00;
  MethodOptions *local_38 [3];
  MethodOptions *local_20;
  MethodOptions *result;
  MethodOptions *param_1_local;
  Tables *this_local;
  
  result = param_1;
  param_1_local = (MethodOptions *)this;
  this_00 = (MethodOptions *)operator_new(0x70);
  MethodOptions::MethodOptions(this_00);
  local_38[0] = this_00;
  local_20 = this_00;
  std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::push_back
            (&this->messages_,(value_type *)local_38);
  return local_20;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.push_back(result);
  return result;
}